

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

SequenceSymbol *
slang::ast::SequenceSymbol::fromSyntax(Scope *scope,SequenceDeclarationSyntax *syntax)

{
  SequenceSymbol *pSVar1;
  int iVar2;
  Compilation *args;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::AssertionPortSymbol_*,_18446744073709551615UL> local_b0;
  span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> local_a0 [2];
  undefined1 local_80 [8];
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  string_view local_38;
  SequenceSymbol *local_28;
  SequenceSymbol *result;
  Compilation *comp;
  SequenceDeclarationSyntax *syntax_local;
  Scope *scope_local;
  
  comp = (Compilation *)syntax;
  syntax_local = (SequenceDeclarationSyntax *)scope;
  args = Scope::getCompilation(scope);
  result = (SequenceSymbol *)args;
  local_38 = parsing::Token::valueText
                       ((Token *)&(comp->options).topModules.
                                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  .hash_policy);
  ports.stackBase._24_8_ =
       parsing::Token::location
                 ((Token *)&(comp->options).topModules.
                            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            .hash_policy);
  local_28 = BumpAllocator::
             emplace<slang::ast::SequenceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&args->super_BumpAllocator,args,&local_38,
                        (SourceLocation *)(ports.stackBase + 0x18));
  Symbol::setSyntax(&local_28->super_Symbol,(SyntaxNode *)comp);
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> *)local_80);
  src = extraout_RDX;
  if ((comp->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    AssertionPortSymbol::buildPorts
              (&local_28->super_Scope,
               (AssertionItemPortListSyntax *)
               (comp->options).paramOverrides.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *)local_80);
    src = extraout_RDX_00;
  }
  iVar2 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    ((SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *)local_80,
                     (EVP_PKEY_CTX *)result,src);
  local_b0.data_ = (pointer)CONCAT44(extraout_var,iVar2);
  nonstd::span_lite::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::AssertionPortSymbol_*,_18446744073709551615UL,_0>(local_a0,&local_b0);
  pSVar1 = local_28;
  (local_28->ports).data_ = local_a0[0].data_;
  (local_28->ports).size_ = local_a0[0].size_;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> *)local_80);
  return pSVar1;
}

Assistant:

SequenceSymbol& SequenceSymbol::fromSyntax(const Scope& scope,
                                           const SequenceDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SequenceSymbol>(comp, syntax.name.valueText(),
                                               syntax.name.location());
    result->setSyntax(syntax);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList)
        AssertionPortSymbol::buildPorts(*result, *syntax.portList, ports);
    result->ports = ports.copy(comp);

    return *result;
}